

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall
QGraphicsDropShadowEffect::setOffset(QGraphicsDropShadowEffect *this,QPointF *offset)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QPointF local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  local_30 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8));
  bVar2 = qFuzzyCompare(&local_30,offset);
  if (!bVar2) {
    QPixmapDropShadowFilter::setOffset(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8),offset);
    QGraphicsEffect::updateBoundingRect(&this->super_QGraphicsEffect);
    offsetChanged(this,offset);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsDropShadowEffect::setOffset(const QPointF &offset)
{
    Q_D(QGraphicsDropShadowEffect);
    if (d->filter->offset() == offset)
        return;

    d->filter->setOffset(offset);
    updateBoundingRect();
    emit offsetChanged(offset);
}